

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

string * format<char*>(int fmt_num,string *fmt,char *arg)

{
  undefined4 in_register_0000003c;
  string *this;
  string local_c0 [48];
  string local_90 [32];
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [39];
  undefined1 local_29;
  char *arg_local;
  string *fmt_local;
  string *psStack_10;
  int fmt_num_local;
  string *output;
  
  this = (string *)CONCAT44(in_register_0000003c,fmt_num);
  fmt_local._4_4_ = SUB84(fmt,0);
  local_29 = 0;
  arg_local = arg;
  psStack_10 = this;
  std::__cxx11::string::string(this,(string *)arg);
  format<int>((int)local_90);
  std::operator+((char)local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7b);
  std::operator+(local_50,(char)local_70);
  format<char*>((char *)local_c0);
  replace_positional((string *)this,local_50,local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  return this;
}

Assistant:

const std::string format (int fmt_num, const std::string& fmt, T arg)
{
    std::string output = fmt;
    replace_positional (output, '{' + format (fmt_num) + '}', format (arg));
    return output;
}